

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::DirectionalAtypeParameters> *this)

{
  GenericData::~GenericData(&this->super_GenericData);
  operator_delete(this,0x70);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}